

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAudioFX_reverb.c
# Opt level: O3

FAudio_ChannelPositionFlags FAudio_GetChannelPositionFlags(int32_t total_channels,int32_t channel)

{
  undefined *puVar1;
  
  switch(total_channels) {
  case 1:
    return Position_Center;
  case 2:
    return Position_Right - (channel == 0);
  case 4:
    if ((uint)channel < 4) {
      puVar1 = &DAT_001269a0;
LAB_00116692:
      return *(FAudio_ChannelPositionFlags *)(puVar1 + (ulong)(uint)channel * 4);
    }
    break;
  case 5:
    if ((uint)channel < 5) {
      puVar1 = &DAT_00126938;
      goto LAB_00116692;
    }
  }
  return Position_Left;
}

Assistant:

static FAudio_ChannelPositionFlags FAudio_GetChannelPositionFlags(int32_t total_channels, int32_t channel)
{
	switch (total_channels)
	{
		case 1:
			return Position_Center;

		case 2:
			return (channel == 0) ? Position_Left : Position_Right;

		case 4:
			switch (channel)
			{
				case 0:
					return Position_Left;
				case 1:
					return Position_Right;
				case 2:
					return Position_Left | Position_Rear;
				case 3:
					return Position_Right | Position_Rear;
			}
			FAudio_assert(0 && "Unsupported channel count");
			break;
		case 5:
			switch (channel)
			{
				case 0:
					return Position_Left;
				case 1:
					return Position_Right;
				case 2:
					return Position_Center;
				case 3:
					return Position_Left | Position_Rear;
				case 4:
					return Position_Right | Position_Rear;
			}
			FAudio_assert(0 && "Unsupported channel count");
			break;
		default:
			FAudio_assert(0 && "Unsupported channel count");
			break;
	}

	/* shouldn't happen, but default to left speaker */
	return Position_Left;
}